

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool __thiscall
duckdb_snappy::SnappyIOVecWriter::AppendFromSelf
          (SnappyIOVecWriter *this,size_t offset,size_t len,char **param_3)

{
  bool bVar1;
  iovec *piVar2;
  iovec *piVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  iovec *piVar7;
  ulong uVar8;
  
  if (this->total_written_ <= offset - 1) {
    return false;
  }
  if (this->output_limit_ - this->total_written_ < len) {
LAB_01f2c3b6:
    bVar1 = false;
  }
  else {
    piVar2 = this->curr_iov_;
    uVar4 = this->curr_iov_remaining_;
    uVar5 = piVar2->iov_len - uVar4;
    piVar7 = piVar2;
    while ((uVar8 = uVar5, offset != 0 && (uVar8 = uVar5 - offset, uVar5 < offset))) {
      offset = offset - uVar5;
      piVar3 = piVar7 + -1;
      piVar7 = piVar7 + -1;
      uVar5 = piVar3->iov_len;
    }
    for (; len != 0; len = len - uVar5) {
      while (piVar2 == piVar7) {
        if (uVar4 != 0) {
          uVar5 = len;
          if (uVar4 < len) {
            uVar5 = uVar4;
          }
          pcVar6 = this->curr_iov_output_;
          anon_unknown_3::IncrementalCopy
                    ((char *)((long)piVar7->iov_base + uVar8),pcVar6,pcVar6 + uVar5,pcVar6 + uVar4);
          this->curr_iov_output_ = this->curr_iov_output_ + uVar5;
          uVar4 = this->curr_iov_remaining_ - uVar5;
          this->curr_iov_remaining_ = uVar4;
          uVar8 = uVar8 + uVar5;
          this->total_written_ = this->total_written_ + uVar5;
          goto LAB_01f2c4a1;
        }
        piVar3 = piVar2 + 1;
        if (this->output_iov_end_ <= piVar3) goto LAB_01f2c3b6;
        this->curr_iov_ = piVar3;
        this->curr_iov_output_ = (char *)piVar3->iov_base;
        uVar4 = piVar2[1].iov_len;
        this->curr_iov_remaining_ = uVar4;
        piVar2 = piVar3;
      }
      uVar4 = piVar7->iov_len - uVar8;
      pcVar6 = (char *)((long)piVar7->iov_base + uVar8);
      uVar5 = uVar4;
      if (len < uVar4) {
        uVar5 = len;
      }
      if (uVar4 < len) {
        uVar8 = 0;
      }
      AppendNoCheck(this,pcVar6,uVar5);
      piVar7 = piVar7 + (uVar4 < len);
      uVar4 = this->curr_iov_remaining_;
LAB_01f2c4a1:
      piVar2 = this->curr_iov_;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

inline bool AppendFromSelf(size_t offset, size_t len, char**) {
    // See SnappyArrayWriter::AppendFromSelf for an explanation of
    // the "offset - 1u" trick.
    if (offset - 1u >= total_written_) {
      return false;
    }
    const size_t space_left = output_limit_ - total_written_;
    if (len > space_left) {
      return false;
    }

    // Locate the iovec from which we need to start the copy.
    const iovec* from_iov = curr_iov_;
    size_t from_iov_offset = curr_iov_->iov_len - curr_iov_remaining_;
    while (offset > 0) {
      if (from_iov_offset >= offset) {
        from_iov_offset -= offset;
        break;
      }

      offset -= from_iov_offset;
      --from_iov;
#if !defined(NDEBUG)
      assert(from_iov >= output_iov_);
#endif  // !defined(NDEBUG)
      from_iov_offset = from_iov->iov_len;
    }

    // Copy <len> bytes starting from the iovec pointed to by from_iov_index to
    // the current iovec.
    while (len > 0) {
      assert(from_iov <= curr_iov_);
      if (from_iov != curr_iov_) {
        const size_t to_copy =
            std::min(from_iov->iov_len - from_iov_offset, len);
        AppendNoCheck(GetIOVecPointer(from_iov, from_iov_offset), to_copy);
        len -= to_copy;
        if (len > 0) {
          ++from_iov;
          from_iov_offset = 0;
        }
      } else {
        size_t to_copy = curr_iov_remaining_;
        if (to_copy == 0) {
          // This iovec is full. Go to the next one.
          if (curr_iov_ + 1 >= output_iov_end_) {
            return false;
          }
          ++curr_iov_;
          curr_iov_output_ = reinterpret_cast<char*>(curr_iov_->iov_base);
          curr_iov_remaining_ = curr_iov_->iov_len;
          continue;
        }
        if (to_copy > len) {
          to_copy = len;
        }
        assert(to_copy > 0);

        IncrementalCopy(GetIOVecPointer(from_iov, from_iov_offset),
                        curr_iov_output_, curr_iov_output_ + to_copy,
                        curr_iov_output_ + curr_iov_remaining_);
        curr_iov_output_ += to_copy;
        curr_iov_remaining_ -= to_copy;
        from_iov_offset += to_copy;
        total_written_ += to_copy;
        len -= to_copy;
      }
    }

    return true;
  }